

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O0

void __thiscall fineftp::FtpSession::handleFtpCommandSIZE(FtpSession *this,string *param)

{
  bool bVar1;
  byte bVar2;
  Permission PVar3;
  _Ios_Openmode _Var4;
  _Ios_Openmode _Var5;
  element_type *peVar6;
  streamoff sVar7;
  undefined1 auVar8 [16];
  string local_4c0 [32];
  stringstream local_4a0 [8];
  stringstream rep;
  ostream local_490 [383];
  allocator local_311;
  string local_310 [32];
  fpos<__mbstate_t> local_2f0;
  undefined1 local_2e0 [8];
  pos_type file_size;
  string local_2c8 [32];
  undefined1 local_2a8 [8];
  ifstream file;
  undefined1 local_98 [4];
  openmode open_mode;
  string local_path;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  object_fns *local_18;
  string *param_local;
  FtpSession *this_local;
  
  local_18 = (object_fns *)param;
  param_local = (string *)this;
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->logged_in_user_);
  if (bVar1) {
    peVar6 = ::std::__shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->logged_in_user_);
    PVar3 = operator&(peVar6->permissions_,FileRead);
    if (PVar3 == None) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_70,"Permission denied",&local_71);
      sendFtpMessage(this,ACTION_NOT_TAKEN,(string *)local_70);
      ::std::__cxx11::string::~string(local_70);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    else {
      toLocalPath((FtpSession *)local_98,(string *)this);
      bVar1 = this->data_type_binary_;
      _Var4 = std::operator|(_S_in,_S_bin);
      _Var5 = _S_in;
      if ((bVar1 & 1U) != 0) {
        _Var5 = _Var4;
      }
      _Var5 = std::operator|(_S_ate,_Var5);
      ::std::ifstream::ifstream(local_2a8,(string *)local_98,_Var5);
      bVar2 = ::std::ios::good();
      if ((bVar2 & 1) == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2c8,"Error opening file for size retrieval",
                   (allocator *)(file_size._M_state.__value.__wchb + 3));
        sendFtpMessage(this,ACTION_ABORTED_LOCAL_ERROR,(string *)local_2c8);
        ::std::__cxx11::string::~string(local_2c8);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)(file_size._M_state.__value.__wchb + 3));
        file_size._M_state.__count = 1;
      }
      else {
        auVar8 = ::std::istream::tellg();
        file_size._M_off = auVar8._8_8_;
        local_2e0 = auVar8._0_8_;
        std::fpos<__mbstate_t>::fpos(&local_2f0,-1);
        bVar1 = ::std::operator==(&local_2f0,(fpos<__mbstate_t> *)local_2e0);
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_310,"Error getting file size",&local_311);
          sendFtpMessage(this,ACTION_ABORTED_LOCAL_ERROR,(string *)local_310);
          ::std::__cxx11::string::~string(local_310);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_311);
          file_size._M_state.__count = 1;
        }
        else {
          ::std::__cxx11::stringstream::stringstream(local_4a0);
          sVar7 = ::std::fpos::operator_cast_to_long((fpos *)local_2e0);
          ::std::ostream::operator<<(local_490,sVar7);
          ::std::__cxx11::stringstream::str();
          sendFtpMessage(this,FILE_STATUS,local_4c0);
          ::std::__cxx11::string::~string((string *)local_4c0);
          ::std::__cxx11::stringstream::~stringstream(local_4a0);
          file_size._M_state.__count = 0;
        }
      }
      ::std::ifstream::~ifstream(local_2a8);
      ::std::__cxx11::string::~string((string *)local_98);
    }
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"Not logged in",&local_39);
    sendFtpMessage(this,NOT_LOGGED_IN,(string *)local_38);
    ::std::__cxx11::string::~string(local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void FtpSession::handleFtpCommandSIZE(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN, "Not logged in");
      return;
    }
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::FileRead) == 0)
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    std::string local_path = toLocalPath(param);

    std::ios::openmode open_mode =
       std::ios::ate | (data_type_binary_ ? (std::ios::in | std::ios::binary) : (std::ios::in));
#if defined(WIN32) && !defined(__GNUG__)
    std::ifstream file(StrConvert::Utf8ToWide(local_path), open_mode);
#else
    std::ifstream file(local_path, open_mode);
#endif

    if (!file.good())
    {
      sendFtpMessage(FtpReplyCode::ACTION_ABORTED_LOCAL_ERROR, "Error opening file for size retrieval");
      return;
    }

    // RFC 3659 actually states that the returned size should depend on the STRU, MODE, and TYPE and that
    // the returned size should be exact. We don't comply with this here. The size returned is the
    // size for TYPE=I.
    auto file_size = file.tellg();
    if (std::fstream::pos_type(-1) == file_size)
    {
      sendFtpMessage(FtpReplyCode::ACTION_ABORTED_LOCAL_ERROR, "Error getting file size");
      return;
    }

    // Form reply string
    std::stringstream rep;
    rep << file_size;

    sendFtpMessage(FtpReplyCode::FILE_STATUS, rep.str());
  }